

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O3

void ssdp_read(SOCKET *rsock,fd_set *set)

{
  uint socket;
  uint uVar1;
  int iVar2;
  
  socket = *rsock;
  if (socket != 0xffffffff) {
    uVar1 = socket + 0x3f;
    if (-1 < (int)socket) {
      uVar1 = socket;
    }
    if (((ulong)set->__fds_bits[(int)uVar1 >> 6] >> ((ulong)socket & 0x3f) & 1) != 0) {
      iVar2 = readFromSSDPSocket(socket);
      if (iVar2 != 0) {
        UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x224,
                   "miniserver: Error in readFromSSDPSocket(%d): closing socket\n",
                   (ulong)(uint)*rsock);
        if (*rsock != -1) {
          close(*rsock);
        }
        *rsock = -1;
      }
    }
  }
  return;
}

Assistant:

static void ssdp_read(SOCKET *rsock, fd_set *set)
{
	if (*rsock != INVALID_SOCKET && FD_ISSET(*rsock, set)) {
		int ret = readFromSSDPSocket(*rsock);
		if (ret != 0) {
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"miniserver: Error in readFromSSDPSocket(%d): "
				"closing socket\n",
				*rsock);
			sock_close(*rsock);
			*rsock = INVALID_SOCKET;
		}
	}
}